

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

double NEST::NESTcalc::GetDensity
                 (double Kelvin,double bara,bool *inGas,uint64_t evtNum,double molarMass)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (bVar1) {
    dVar2 = log(Kelvin);
    dVar3 = exp(dVar2 * -6.539938 + -1464.718291 / Kelvin + 45.97394);
    if ((bara < dVar3) || (*inGas == true)) {
      dVar2 = bara * 100000.0;
      dVar4 = Kelvin * 8.31446261815324;
      dVar5 = pow(dVar4,3.0);
      dVar2 = molarMass * 1e-06 *
              (1.0 / (dVar5 / (dVar4 * dVar4 * dVar2 + dVar2 * 0.425 * dVar2) + 5.105e-05));
      bVar1 = true;
      if ((evtNum == 0) && (bara < dVar3)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\nWARNING: ARGON GAS PHASE. IS THAT WHAT YOU WANTED?\n",
                   0x34);
      }
    }
    else {
      dVar2 = 1.4;
      bVar1 = false;
    }
    *inGas = bVar1;
  }
  else if ((161.4 <= Kelvin) || (bVar1 = ValidityTests::nearlyEqual(54.0,54.0,1e-09), !bVar1)) {
    if (289.7 <= Kelvin) {
      dVar2 = 1.79769313486232e+308;
    }
    else {
      bVar1 = ValidityTests::nearlyEqual(54.0,54.0,1e-09);
      if (bVar1) {
        dVar2 = pow(10.0,-667.16 / Kelvin + 4.0519);
      }
      else {
        dVar2 = 1.0;
      }
    }
    if ((bara < dVar2) || (*inGas == true)) {
      dVar3 = bara * 100000.0;
      dVar5 = Kelvin * 8.31446261815324;
      dVar4 = pow(dVar5,3.0);
      if ((evtNum == 0) && (bara < dVar2)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\nWARNING: GAS PHASE. IS THAT WHAT YOU WANTED?\n",0x2e);
      }
      dVar2 = molarMass * 1e-06 *
              (1.0 / (dVar4 / (dVar5 * dVar5 * dVar3 + dVar3 * 0.425 * dVar3) + 5.105e-05));
      *inGas = true;
    }
    else {
      *inGas = false;
      dVar2 = exp(Kelvin * -0.08259886471432352);
      dVar3 = (Kelvin + -408.2025127617221) / 27.863170223154846;
      dVar3 = exp(-dVar3 * dVar3);
      dVar4 = (Kelvin + -636.8859734504267) / 112.25818853661815;
      dVar4 = exp(-dVar4 * dVar4);
      dVar5 = (Kelvin + 48.84056892459734) / 7380.414717207111;
      dVar5 = exp(-dVar5 * dVar5);
      dVar2 = dVar5 * 834.5053837068261 +
              dVar4 * -5496.450635174306 + dVar2 * 299.7093808469133 + dVar3 * -1880128.6589442915 +
              -830.8631040594227;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\nWARNING: SOLID PHASE. IS THAT WHAT YOU WANTED?\n",0x30);
    dVar2 = 3.41;
  }
  return dVar2;
}

Assistant:

double NESTcalc::GetDensity(double Kelvin, double bara, bool &inGas,
                            uint64_t evtNum, double molarMass) {
  // currently only for fixed pressure (the saturated vapor pressure); will add
  // pressure dependence later

  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.)) {
    double density = 0.;
    double VaporP_bar = 0.;
    VaporP_bar = exp(45.973940 - 1464.718291 / Kelvin - 6.539938 * log(Kelvin));
    if (bara < VaporP_bar || inGas) {
      double p_Pa = bara * 1e5;
      density =
          1. /
          (pow(RidealGas * Kelvin, 3.) /
               (p_Pa * pow(RidealGas * Kelvin, 2.) + RealGasA * p_Pa * p_Pa) +
           RealGasB);  // Van der Waals equation, mol/m^3
      density *= molarMass * 1e-6;
      if (bara < VaporP_bar && evtNum == 0)
        cerr << "\nWARNING: ARGON GAS PHASE. IS THAT WHAT YOU WANTED?\n";
      inGas = true;
      return density;
    }
    inGas = false;
    return 1.4;
  }
  // if (MOLAR_MASS > 134.5) //enrichment for 0vBB expt (~0.8 Xe-136)
  // return 3.0305; // ±0.0077 g/cm^3, EXO-200 @167K: arXiv:1908.04128

  if (Kelvin < 161.40 &&
      ValidityTests::nearlyEqual(ATOM_NUM, 54.)) {  // solid Xenon
    cerr << "\nWARNING: SOLID PHASE. IS THAT WHAT YOU WANTED?\n";
    return 3.41;  // from Yoo at 157K
    // other sources say 3.1 (Wikipedia, 'minimum') and 3.640g/mL at an unknown
    // temperature
  }

  double VaporP_bar;  // we will calculate using NIST
  if (Kelvin < 289.7) {
    if (ValidityTests::nearlyEqual(ATOM_NUM, 54.))
      VaporP_bar = pow(10., 4.0519 - 667.16 / Kelvin);
    else {
      VaporP_bar = 1.;
    }
  } else {
    VaporP_bar = DBL_MAX;
  }
  if (bara < VaporP_bar || inGas) {
    double p_Pa = bara * 1e5;
    double density =
        1. /
        (pow(RidealGas * Kelvin, 3.) /
             (p_Pa * pow(RidealGas * Kelvin, 2.) + RealGasA * p_Pa * p_Pa) +
         RealGasB);  // Van der Waals equation, mol/m^3
    density *= molarMass * 1e-6;
    if (bara < VaporP_bar && evtNum == 0)
      cerr << "\nWARNING: GAS PHASE. IS THAT WHAT YOU WANTED?\n";
    inGas = true;
    return density;  // in g/cm^3
  }
  inGas = false;
  return 2.9970938084691329E+02 * exp(-8.2598864714323525E-02 * Kelvin) -
         1.8801286589442915E+06 * exp(-pow((Kelvin - 4.0820251276172212E+02) /
                                               2.7863170223154846E+01,
                                           2.)) -
         5.4964506351743057E+03 * exp(-pow((Kelvin - 6.3688597345042672E+02) /
                                               1.1225818853661815E+02,
                                           2.)) +
         8.3450538370682614E+02 * exp(-pow((Kelvin + 4.8840568924597342E+01) /
                                               7.3804147172071107E+03,
                                           2.)) -
         8.3086310405942265E+02;  // in grams per cubic centimeter based on
                                  // zunzun fit to NIST data; will add gas later
}